

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program.tab.cc
# Opt level: O0

void __thiscall
tchecker::parsing::program::parser_t::yy_print_<tchecker::parsing::program::parser_t::by_state>
          (parser_t *this,ostream *yyo,
          basic_symbol<tchecker::parsing::program::parser_t::by_state> *yysym)

{
  bool bVar1;
  ostream *poVar2;
  basic_ostream<char,_std::char_traits<char>_> *pbVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  __shared_ptr<tchecker::statement_t,_(__gnu_cxx::_Lock_policy)2> *p_Var5;
  __shared_ptr_access<tchecker::statement_t,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var6;
  element_type *peVar7;
  __shared_ptr<tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2> *__p;
  binary_operator_t *pbVar8;
  __shared_ptr_access<tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var9;
  element_type *peVar10;
  __shared_ptr_access<tchecker::lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *this_00;
  element_type *peVar11;
  __shared_ptr_access<tchecker::var_expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_01
  ;
  element_type *peVar12;
  int *piVar13;
  char *local_70;
  string local_50;
  symbol_kind_type local_2c;
  ostream *poStack_28;
  symbol_kind_type yykind;
  ostream *yyoutput;
  basic_symbol<tchecker::parsing::program::parser_t::by_state> *yysym_local;
  ostream *yyo_local;
  parser_t *this_local;
  
  poStack_28 = yyo;
  yyoutput = (ostream *)yysym;
  yysym_local = (basic_symbol<tchecker::parsing::program::parser_t::by_state> *)yyo;
  yyo_local = (ostream *)this;
  bVar1 = basic_symbol<tchecker::parsing::program::parser_t::by_state>::empty(yysym);
  if (bVar1) {
    std::operator<<((ostream *)yysym_local,"empty symbol");
  }
  else {
    local_2c = by_state::kind((by_state *)yyoutput);
    if (local_2c < S_YYACCEPT) {
      local_70 = "token";
    }
    else {
      local_70 = "nterm";
    }
    poVar2 = std::operator<<((ostream *)yysym_local,local_70);
    poVar2 = std::operator<<(poVar2,' ');
    basic_symbol<tchecker::parsing::program::parser_t::by_state>::name_abi_cxx11_
              (&local_50,(basic_symbol<tchecker::parsing::program::parser_t::by_state> *)yyoutput);
    poVar2 = std::operator<<(poVar2,(string *)&local_50);
    poVar2 = std::operator<<(poVar2," (");
    pbVar3 = program::operator<<(poVar2,(location *)(yyoutput + 0x40));
    std::operator<<(pbVar3,": ");
    std::__cxx11::string::~string((string *)&local_50);
    poVar2 = poStack_28;
    switch(local_2c) {
    case S_TOK_ID:
      pbVar4 = value_type::as<std::__cxx11::string>((value_type *)(yyoutput + 0x10));
      std::operator<<(poVar2,(string *)pbVar4);
      break;
    case S_TOK_INTEGER:
      pbVar4 = value_type::as<std::__cxx11::string>((value_type *)(yyoutput + 0x10));
      std::operator<<(poVar2,(string *)pbVar4);
      break;
    default:
      break;
    case S_sequence_statement:
      p_Var6 = (__shared_ptr_access<tchecker::statement_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)value_type::as<std::shared_ptr<tchecker::statement_t>>
                            ((value_type *)(yyoutput + 0x10));
      peVar7 = std::
               __shared_ptr_access<tchecker::statement_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(p_Var6);
      (*peVar7->_vptr_statement_t[4])(peVar7,poStack_28);
      break;
    case S_statement:
      p_Var6 = (__shared_ptr_access<tchecker::statement_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)value_type::as<std::shared_ptr<tchecker::statement_t>>
                            ((value_type *)(yyoutput + 0x10));
      peVar7 = std::
               __shared_ptr_access<tchecker::statement_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(p_Var6);
      (*peVar7->_vptr_statement_t[4])(peVar7,poStack_28);
      break;
    case S_if_statement:
      p_Var5 = &value_type::as<std::shared_ptr<tchecker::statement_t>>
                          ((value_type *)(yyoutput + 0x10))->
                super___shared_ptr<tchecker::statement_t,_(__gnu_cxx::_Lock_policy)2>;
      std::operator<<(poVar2,p_Var5);
      break;
    case S_loop_statement:
      p_Var5 = &value_type::as<std::shared_ptr<tchecker::statement_t>>
                          ((value_type *)(yyoutput + 0x10))->
                super___shared_ptr<tchecker::statement_t,_(__gnu_cxx::_Lock_policy)2>;
      std::operator<<(poVar2,p_Var5);
      break;
    case S_local_statement:
      p_Var5 = &value_type::as<std::shared_ptr<tchecker::statement_t>>
                          ((value_type *)(yyoutput + 0x10))->
                super___shared_ptr<tchecker::statement_t,_(__gnu_cxx::_Lock_policy)2>;
      std::operator<<(poVar2,p_Var5);
      break;
    case S_simple_statement:
      p_Var5 = &value_type::as<std::shared_ptr<tchecker::statement_t>>
                          ((value_type *)(yyoutput + 0x10))->
                super___shared_ptr<tchecker::statement_t,_(__gnu_cxx::_Lock_policy)2>;
      std::operator<<(poVar2,p_Var5);
      break;
    case S_assignment:
      p_Var6 = (__shared_ptr_access<tchecker::statement_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)value_type::as<std::shared_ptr<tchecker::statement_t>>
                            ((value_type *)(yyoutput + 0x10));
      peVar7 = std::
               __shared_ptr_access<tchecker::statement_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(p_Var6);
      (*peVar7->_vptr_statement_t[4])(peVar7,poStack_28);
      break;
    case S_conjunctive_formula:
      p_Var9 = (__shared_ptr_access<tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)value_type::as<std::shared_ptr<tchecker::expression_t>>
                            ((value_type *)(yyoutput + 0x10));
      peVar10 = std::
                __shared_ptr_access<tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->(p_Var9);
      (*peVar10->_vptr_expression_t[4])(peVar10,poStack_28);
      break;
    case S_non_atomic_conjunctive_formula:
      p_Var9 = (__shared_ptr_access<tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)value_type::as<std::shared_ptr<tchecker::expression_t>>
                            ((value_type *)(yyoutput + 0x10));
      peVar10 = std::
                __shared_ptr_access<tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->(p_Var9);
      (*peVar10->_vptr_expression_t[4])(peVar10,poStack_28);
      break;
    case S_atomic_formula:
      p_Var9 = (__shared_ptr_access<tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)value_type::as<std::shared_ptr<tchecker::expression_t>>
                            ((value_type *)(yyoutput + 0x10));
      peVar10 = std::
                __shared_ptr_access<tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->(p_Var9);
      (*peVar10->_vptr_expression_t[4])(peVar10,poStack_28);
      break;
    case S_predicate_formula:
      p_Var9 = (__shared_ptr_access<tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)value_type::as<std::shared_ptr<tchecker::expression_t>>
                            ((value_type *)(yyoutput + 0x10));
      peVar10 = std::
                __shared_ptr_access<tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->(p_Var9);
      (*peVar10->_vptr_expression_t[4])(peVar10,poStack_28);
      break;
    case S_binary_formula:
      __p = &value_type::as<std::shared_ptr<tchecker::expression_t>>
                       ((value_type *)(yyoutput + 0x10))->
             super___shared_ptr<tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>;
      std::operator<<(poVar2,__p);
      break;
    case S_predicate_operator:
      pbVar8 = value_type::as<tchecker::binary_operator_t>((value_type *)(yyoutput + 0x10));
      tchecker::operator<<(poVar2,*pbVar8);
      break;
    case S_term:
      p_Var9 = (__shared_ptr_access<tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)value_type::as<std::shared_ptr<tchecker::expression_t>>
                            ((value_type *)(yyoutput + 0x10));
      peVar10 = std::
                __shared_ptr_access<tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->(p_Var9);
      (*peVar10->_vptr_expression_t[4])(peVar10,poStack_28);
      break;
    case S_lvalue_term:
      this_00 = (__shared_ptr_access<tchecker::lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 *)value_type::as<std::shared_ptr<tchecker::lvalue_expression_t>>
                             ((value_type *)(yyoutput + 0x10));
      peVar11 = std::
                __shared_ptr_access<tchecker::lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->(this_00);
      (**(code **)(*(long *)(&peVar11->field_0x0 + *(long *)((long)*peVar11 + -0x38)) + 0x20))
                (&peVar11->field_0x0 + *(long *)((long)*peVar11 + -0x38),poStack_28);
      break;
    case S_variable_term:
      this_01 = (__shared_ptr_access<tchecker::var_expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 *)value_type::as<std::shared_ptr<tchecker::var_expression_t>>
                             ((value_type *)(yyoutput + 0x10));
      peVar12 = std::
                __shared_ptr_access<tchecker::var_expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->(this_01);
      (**(code **)(*(long *)peVar12 + 0x20))(peVar12,poStack_28);
      break;
    case S_integer:
      piVar13 = value_type::as<int>((value_type *)(yyoutput + 0x10));
      std::ostream::operator<<(poVar2,*piVar13);
    }
    std::operator<<((ostream *)yysym_local,')');
  }
  return;
}

Assistant:

void
  parser_t::yy_print_ (std::ostream& yyo, const basic_symbol<Base>& yysym) const
  {
    std::ostream& yyoutput = yyo;
    YY_USE (yyoutput);
    if (yysym.empty ())
      yyo << "empty symbol";
    else
      {
        symbol_kind_type yykind = yysym.kind ();
        yyo << (yykind < YYNTOKENS ? "token" : "nterm")
            << ' ' << yysym.name () << " ("
            << yysym.location << ": ";
        switch (yykind)
    {
      case symbol_kind::S_TOK_ID: // "identifier"
#line 164 "program.yy"
                 { yyoutput << yysym.value.template as < std::string > (); }
#line 504 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/program_parser/program.tab.cc"
        break;

      case symbol_kind::S_TOK_INTEGER: // "integer"
#line 164 "program.yy"
                 { yyoutput << yysym.value.template as < std::string > (); }
#line 510 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/program_parser/program.tab.cc"
        break;

      case symbol_kind::S_sequence_statement: // sequence_statement
#line 165 "program.yy"
                 { yysym.value.template as < std::shared_ptr<tchecker::statement_t> > ()->output(yyoutput); }
#line 516 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/program_parser/program.tab.cc"
        break;

      case symbol_kind::S_statement: // statement
#line 165 "program.yy"
                 { yysym.value.template as < std::shared_ptr<tchecker::statement_t> > ()->output(yyoutput); }
#line 522 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/program_parser/program.tab.cc"
        break;

      case symbol_kind::S_if_statement: // if_statement
#line 164 "program.yy"
                 { yyoutput << yysym.value.template as < std::shared_ptr<tchecker::statement_t> > (); }
#line 528 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/program_parser/program.tab.cc"
        break;

      case symbol_kind::S_loop_statement: // loop_statement
#line 164 "program.yy"
                 { yyoutput << yysym.value.template as < std::shared_ptr<tchecker::statement_t> > (); }
#line 534 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/program_parser/program.tab.cc"
        break;

      case symbol_kind::S_local_statement: // local_statement
#line 164 "program.yy"
                 { yyoutput << yysym.value.template as < std::shared_ptr<tchecker::statement_t> > (); }
#line 540 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/program_parser/program.tab.cc"
        break;

      case symbol_kind::S_simple_statement: // simple_statement
#line 164 "program.yy"
                 { yyoutput << yysym.value.template as < std::shared_ptr<tchecker::statement_t> > (); }
#line 546 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/program_parser/program.tab.cc"
        break;

      case symbol_kind::S_assignment: // assignment
#line 165 "program.yy"
                 { yysym.value.template as < std::shared_ptr<tchecker::statement_t> > ()->output(yyoutput); }
#line 552 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/program_parser/program.tab.cc"
        break;

      case symbol_kind::S_conjunctive_formula: // conjunctive_formula
#line 165 "program.yy"
                 { yysym.value.template as < std::shared_ptr<tchecker::expression_t> > ()->output(yyoutput); }
#line 558 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/program_parser/program.tab.cc"
        break;

      case symbol_kind::S_non_atomic_conjunctive_formula: // non_atomic_conjunctive_formula
#line 165 "program.yy"
                 { yysym.value.template as < std::shared_ptr<tchecker::expression_t> > ()->output(yyoutput); }
#line 564 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/program_parser/program.tab.cc"
        break;

      case symbol_kind::S_atomic_formula: // atomic_formula
#line 165 "program.yy"
                 { yysym.value.template as < std::shared_ptr<tchecker::expression_t> > ()->output(yyoutput); }
#line 570 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/program_parser/program.tab.cc"
        break;

      case symbol_kind::S_predicate_formula: // predicate_formula
#line 165 "program.yy"
                 { yysym.value.template as < std::shared_ptr<tchecker::expression_t> > ()->output(yyoutput); }
#line 576 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/program_parser/program.tab.cc"
        break;

      case symbol_kind::S_binary_formula: // binary_formula
#line 164 "program.yy"
                 { yyoutput << yysym.value.template as < std::shared_ptr<tchecker::expression_t> > (); }
#line 582 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/program_parser/program.tab.cc"
        break;

      case symbol_kind::S_predicate_operator: // predicate_operator
#line 164 "program.yy"
                 { yyoutput << yysym.value.template as < enum tchecker::binary_operator_t > (); }
#line 588 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/program_parser/program.tab.cc"
        break;

      case symbol_kind::S_term: // term
#line 165 "program.yy"
                 { yysym.value.template as < std::shared_ptr<tchecker::expression_t> > ()->output(yyoutput); }
#line 594 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/program_parser/program.tab.cc"
        break;

      case symbol_kind::S_lvalue_term: // lvalue_term
#line 165 "program.yy"
                 { yysym.value.template as < std::shared_ptr<tchecker::lvalue_expression_t> > ()->output(yyoutput); }
#line 600 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/program_parser/program.tab.cc"
        break;

      case symbol_kind::S_variable_term: // variable_term
#line 165 "program.yy"
                 { yysym.value.template as < std::shared_ptr<tchecker::var_expression_t> > ()->output(yyoutput); }
#line 606 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/program_parser/program.tab.cc"
        break;

      case symbol_kind::S_integer: // integer
#line 164 "program.yy"
                 { yyoutput << yysym.value.template as < tchecker::integer_t > (); }
#line 612 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/program_parser/program.tab.cc"
        break;

      default:
        break;
    }
        yyo << ')';
      }
  }